

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.h
# Opt level: O2

TcpClient * __thiscall Liby::TcpClient::setEventLoop(TcpClient *this,EventLoop *loop)

{
  Poller *pPVar1;
  
  if (loop != (EventLoop *)0x0) {
    pPVar1 = EventLoop::getPoller(loop);
    if (pPVar1 != (Poller *)0x0) {
      this->loop_ = loop;
      pPVar1 = EventLoop::getPoller(loop);
      this->poller_ = pPVar1;
      return this;
    }
  }
  __assert_fail("loop && loop->getPoller()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpClient.h"
                ,0x19,"TcpClient &Liby::TcpClient::setEventLoop(EventLoop *)");
}

Assistant:

TcpClient &setEventLoop(EventLoop *loop) {
        assert(loop && loop->getPoller());
        loop_ = loop;
        poller_ = loop->getPoller();
        return *this;
    }